

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O2

void free_line(LINE_DATA *line)

{
  LINE_DATA *pLVar1;
  LINE_DATA *pLVar2;
  LINE_DATA *pLVar3;
  long lVar4;
  
  free_pstring(line->text);
  pLVar1 = line->next;
  pLVar2 = line;
  if (pLVar1 != (LINE_DATA *)0x0) {
    pLVar3 = line->prev;
    if (pLVar3 == (LINE_DATA *)0x0) {
      lVar4 = 0x20;
      pLVar3 = line;
    }
    else {
      pLVar3->next = pLVar1;
      lVar4 = 0x10;
      pLVar1 = pLVar3;
      pLVar3 = (LINE_DATA *)&line->next;
    }
    *(LINE_DATA **)((long)&pLVar3->speech->mob + lVar4) = pLVar1;
  }
  for (; pLVar2 != (LINE_DATA *)0x0; pLVar2 = pLVar2->next) {
    pLVar2->number = pLVar2->number + -1;
  }
  operator_delete(line,0x30);
  return;
}

Assistant:

void free_line(LINE_DATA *line)
{
	LINE_DATA *lptr;

	free_pstring(line->text);

	if (line->next)
	{
		if (line->prev)
		{
			line->prev->next = line->next;
			line->next->prev = line->prev;
		}
		else
		{
			line->speech->first_line = line->next;
		}
	}

	for (lptr = line; lptr; lptr = lptr->next)
	{
		lptr->number--;
	}

	delete line;
}